

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O2

Image * __thiscall
pbrt::RGBFilm::GetImage
          (Image *__return_storage_ptr__,RGBFilm *this,ImageMetadata *metadata,Float splatScale)

{
  Bounds2i *this_00;
  bool bVar1;
  Point2i resolution;
  Allocator alloc;
  long lVar2;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  allocator<char> local_cb;
  allocator<char> local_ca;
  allocator<char> local_c9;
  Image *local_c8;
  Float splatScale_local;
  _Any_data local_b8;
  code *pcStack_a8;
  code *pcStack_a0;
  ColorEncodingHandle local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70 [32];
  string local_50 [32];
  
  local_c8 = __return_storage_ptr__;
  splatScale_local = splatScale;
  if (LOGGING_LogLevel < 1) {
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.cpp"
        ,0x225,"Converting image to RGB and computing final weighted pixel values");
  }
  bVar1 = this->writeFP16;
  this_00 = &(this->super_FilmBase).pixelBounds;
  resolution.super_Tuple2<pbrt::Point2,_int> =
       (Tuple2<pbrt::Point2,_int>)Bounds2<int>::Diagonal(this_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"R",&local_c9);
  std::__cxx11::string::string<std::allocator<char>>(local_70,"G",&local_ca);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"B",&local_cb);
  local_98.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  channels.n = 3;
  channels.ptr = &local_90;
  Image::Image(local_c8,Float - bVar1,resolution,channels,&local_98,alloc);
  lVar2 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&local_90._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  pcStack_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_b8._M_unused._M_object = operator_new(0x18);
  *(RGBFilm **)local_b8._M_unused._0_8_ = this;
  *(Float **)((long)local_b8._M_unused._0_8_ + 8) = &splatScale_local;
  *(Image **)((long)local_b8._M_unused._0_8_ + 0x10) = local_c8;
  pcStack_a0 = std::
               _Function_handler<void_(pbrt::Point2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.cpp:553:32)>
               ::_M_invoke;
  pcStack_a8 = std::
               _Function_handler<void_(pbrt::Point2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.cpp:553:32)>
               ::_M_manager;
  ParallelFor2D((pbrt *)this_00,(Bounds2i *)&local_b8,
                (function<void_(pbrt::Point2<int>)> *)
                std::
                _Function_handler<void_(pbrt::Point2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.cpp:553:32)>
                ::_M_invoke);
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  pstd::optional<pbrt::Bounds2<int>_>::operator=(&metadata->pixelBounds,this_00);
  pstd::optional<pbrt::Point2<int>_>::operator=(&metadata->fullResolution,(Point2<int> *)this);
  pstd::optional<const_pbrt::RGBColorSpace_*>::operator=(&metadata->colorSpace,&this->colorSpace);
  return local_c8;
}

Assistant:

Image RGBFilm::GetImage(ImageMetadata *metadata, Float splatScale) {
    // Convert image to RGB and compute final pixel values
    LOG_VERBOSE("Converting image to RGB and computing final weighted pixel values");
    PixelFormat format = writeFP16 ? PixelFormat::Half : PixelFormat::Float;
    Image image(format, Point2i(pixelBounds.Diagonal()), {"R", "G", "B"});

    ParallelFor2D(pixelBounds, [&](Point2i p) {
        RGB rgb = GetPixelRGB(p, splatScale);

        Point2i pOffset(p.x - pixelBounds.pMin.x, p.y - pixelBounds.pMin.y);
        image.SetChannels(pOffset, {rgb[0], rgb[1], rgb[2]});
    });

    metadata->pixelBounds = pixelBounds;
    metadata->fullResolution = fullResolution;
    metadata->colorSpace = colorSpace;

    return image;
}